

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O3

void __thiscall sfc::Palette::save_act(Palette *this,string *path)

{
  uint uVar1;
  pointer pSVar2;
  void *__s;
  long lVar3;
  undefined1 *puVar4;
  int iVar5;
  pointer puVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  value_type *__val;
  undefined1 uVar11;
  pointer this_00;
  bool bVar12;
  rgba_vec_t colors;
  Subpalette spp;
  rgba_vec_t local_248;
  undefined1 local_230 [8];
  pointer local_228;
  pointer local_218;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_210 [4];
  ios_base local_138 [264];
  int iVar6;
  
  __s = operator_new(0x304);
  uVar11 = 0;
  memset(__s,0,0x304);
  this_00 = (this->_subpalettes).
            super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (this->_subpalettes).
           super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pSVar2) {
    iVar5 = 0;
    do {
      Subpalette::padded((Subpalette *)local_230,this_00);
      Subpalette::normalized_colors(&local_248,(Subpalette *)local_230);
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        bVar12 = false;
      }
      else {
        lVar3 = (long)iVar5;
        iVar6 = 0x100;
        if (0x100 < iVar5) {
          iVar6 = iVar5;
        }
        iVar5 = iVar6 + 1;
        puVar4 = (undefined1 *)((long)__s + lVar3 * 3 + 2);
        puVar7 = local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          uVar1 = *puVar7;
          bVar12 = -1 < (int)uVar1;
          uVar10 = (char)(uVar1 >> 0x10);
          if (bVar12) {
            uVar10 = uVar11;
          }
          uVar9 = (char)(uVar1 >> 8);
          if (bVar12) {
            uVar9 = uVar11;
          }
          uVar8 = (char)uVar1;
          if (bVar12) {
            uVar8 = uVar11;
          }
          puVar4[-2] = uVar8;
          puVar4[-1] = uVar9;
          *puVar4 = uVar10;
          if (0xff < lVar3) {
            bVar12 = true;
            goto LAB_001447ce;
          }
          lVar3 = lVar3 + 1;
          puVar7 = puVar7 + 1;
          puVar4 = puVar4 + 3;
        } while (puVar7 != local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        bVar12 = false;
        iVar5 = (int)lVar3;
      }
LAB_001447ce:
      if (local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_248.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_248.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(local_210);
      if (local_228 != (pointer)0x0) {
        operator_delete(local_228,(long)local_218 - (long)local_228);
      }
      this_00 = this_00 + 1;
    } while (!bVar12 && this_00 != pSVar2);
    uVar11 = (undefined1)iVar5;
  }
  *(undefined1 *)((long)__s + 0x300) = 0;
  *(undefined1 *)((long)__s + 0x301) = uVar11;
  *(undefined2 *)((long)__s + 0x302) = 0xffff;
  std::ofstream::ofstream(local_230,(string *)path,_S_trunc|_S_out|_S_bin);
  std::ostream::write(local_230,(long)__s);
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = _sqrt;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  operator_delete(__s,0x304);
  return;
}

Assistant:

void Palette::save_act(const std::string& path) const {
  byte_vec_t data((256 * 3) + 4);
  int count = 0;

  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    rgba_vec_t colors = spp.normalized_colors();
    for (const auto& c : colors) {
      rgba_color rgba(c);
      data[count * 3 + 0] = rgba.r;
      data[count * 3 + 1] = rgba.g;
      data[count * 3 + 2] = rgba.b;
      if (++count > 256)
        goto done;
    }
  }

done:
  data[0x300] = 0x00;
  data[0x301] = count & 0xff;
  data[0x302] = data[0x303] = 0xff;
  write_file(path, data);
}